

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<std::__cxx11::string,char_const(&)[11],std::__cxx11::string,char_const(&)[6],std::__cxx11::string,char_const(&)[6],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          char (*ts) [11],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,
          char (*ts_2) [6],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,
          char (*ts_4) [6],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,
          char (*ts_6) [2],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,
          char (*ts_8) [9],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_9,
          char (*ts_10) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_11
          ,char (*ts_12) [4])

{
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,t);
  this->statement_count = this->statement_count + 1;
  statement_inner<char_const(&)[11],std::__cxx11::string,char_const(&)[6],std::__cxx11::string,char_const(&)[6],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}